

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void TranslateReturn(ExpressionTranslateContext *ctx,ExprReturn *expression)

{
  uint uVar1;
  ExprBase *expression_00;
  TypeBase *pTVar2;
  ExpressionContext *pEVar3;
  ExprBase *expression_01;
  char *pcVar4;
  
  if (expression->coroutineStateUpdate != (ExprBase *)0x0) {
    Translate(ctx,expression->coroutineStateUpdate);
    Print(ctx,";");
    OutputContext::Print(ctx->output,"\n",1);
    PrintIndent(ctx);
  }
  expression_00 = expression->closures;
  if ((expression_00 == (ExprBase *)0x0) || (expression_00->typeID != 0x37)) {
    if (ctx->currentFunction == (FunctionData *)0x0) goto LAB_00258900;
    expression_01 = expression->value;
    if (expression_01->type == ctx->ctx->typeVoid) goto LAB_00258a3a;
  }
  else {
    uVar1 = expression_00[1].typeID;
    if (ctx->currentFunction == (FunctionData *)0x0) {
      if (uVar1 != 0) {
        __assert_fail("!closures",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                      ,0x3cb,"void TranslateReturn(ExpressionTranslateContext &, ExprReturn *)");
      }
LAB_00258900:
      pTVar2 = expression->value->type;
      pEVar3 = ctx->ctx;
      if ((((pTVar2 == pEVar3->typeBool) || (pTVar2 == pEVar3->typeChar)) ||
          (pTVar2 == pEVar3->typeShort)) || (pTVar2 == pEVar3->typeInt)) {
        pcVar4 = "__nullcOutputResultInt((int)(";
      }
      else if (pTVar2 == pEVar3->typeLong) {
        pcVar4 = "__nullcOutputResultLong((long long)(";
      }
      else {
        pcVar4 = "__nullcOutputResultDouble((double)(";
        if (((pTVar2 != pEVar3->typeFloat) && (pTVar2 != pEVar3->typeDouble)) &&
           ((pTVar2 == (TypeBase *)0x0 ||
            (pcVar4 = "__nullcOutputResultInt((int)(", pTVar2->typeID != 0x19)))) {
          __assert_fail("!\"unknown global return type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                        ,0x3d6,"void TranslateReturn(ExpressionTranslateContext &, ExprReturn *)");
        }
      }
      Print(ctx,pcVar4);
      Translate(ctx,expression->value);
      pTVar2 = expression->value->type;
      if ((pTVar2 != (TypeBase *)0x0) && (pTVar2->typeID == 0x19)) {
        Print(ctx,".value");
      }
      Print(ctx,"));");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
      pcVar4 = "return 0;";
      goto LAB_00258a7a;
    }
    expression_01 = expression->value;
    if (expression_01->type == ctx->ctx->typeVoid) {
      if (uVar1 != 0) {
        Translate(ctx,expression_00);
        Print(ctx,";");
        OutputContext::Print(ctx->output,"\n",1);
        PrintIndent(ctx);
        expression_01 = expression->value;
      }
LAB_00258a3a:
      Translate(ctx,expression_01);
      Print(ctx,";");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
      pcVar4 = "return;";
      goto LAB_00258a7a;
    }
    if (uVar1 != 0) {
      Print(ctx,"__nullcReturnValue_%d = ",(ulong)ctx->nextReturnValueId);
      Translate(ctx,expression->value);
      Print(ctx,";");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
      Translate(ctx,expression->closures);
      Print(ctx,";");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
      Print(ctx,"return __nullcReturnValue_%d;",(ulong)ctx->nextReturnValueId);
      return;
    }
  }
  Print(ctx,"return ");
  Translate(ctx,expression->value);
  pcVar4 = ";";
LAB_00258a7a:
  Print(ctx,pcVar4);
  return;
}

Assistant:

void TranslateReturn(ExpressionTranslateContext &ctx, ExprReturn *expression)
{
	if(expression->coroutineStateUpdate)
	{
		Translate(ctx, expression->coroutineStateUpdate);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);
	}

	ExprSequence *closures = getType<ExprSequence>(expression->closures);

	if(closures && closures->expressions.empty())
		closures = NULL;

	if(!ctx.currentFunction)
	{
		assert(!closures);

		if(expression->value->type == ctx.ctx.typeBool || expression->value->type == ctx.ctx.typeChar || expression->value->type == ctx.ctx.typeShort || expression->value->type == ctx.ctx.typeInt)
			Print(ctx, "__nullcOutputResultInt((int)(");
		else if(expression->value->type == ctx.ctx.typeLong)
			Print(ctx, "__nullcOutputResultLong((long long)(");
		else if(expression->value->type == ctx.ctx.typeFloat || expression->value->type == ctx.ctx.typeDouble)
			Print(ctx, "__nullcOutputResultDouble((double)(");
		else if(isType<TypeEnum>(expression->value->type))
			Print(ctx, "__nullcOutputResultInt((int)(");
		else
			assert(!"unknown global return type");

		Translate(ctx, expression->value);

		if(isType<TypeEnum>(expression->value->type))
			Print(ctx, ".value");

		Print(ctx, "));");
		PrintLine(ctx);
		PrintIndent(ctx);

		Print(ctx, "return 0;");
	}
	else
	{
		if(expression->value->type == ctx.ctx.typeVoid)
		{
			if(closures)
			{
				Translate(ctx, expression->closures);
				Print(ctx, ";");
				PrintLine(ctx);
				PrintIndent(ctx);
			}

			Translate(ctx, expression->value);
			Print(ctx, ";");
			PrintLine(ctx);
			PrintIndent(ctx);

			Print(ctx, "return;");
		}
		else if(closures)
		{
			Print(ctx, "__nullcReturnValue_%d = ", ctx.nextReturnValueId);
			Translate(ctx, expression->value);
			Print(ctx, ";");
			PrintLine(ctx);
			PrintIndent(ctx);

			Translate(ctx, expression->closures);
			Print(ctx, ";");
			PrintLine(ctx);
			PrintIndent(ctx);

			Print(ctx, "return __nullcReturnValue_%d;", ctx.nextReturnValueId);
		}
		else
		{
			Print(ctx, "return ");
			Translate(ctx, expression->value);
			Print(ctx, ";");
		}
	}
}